

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::RemovePrefix(ON_wString *this,wchar_t *prefix,ON_Locale *locale,bool bIgnoreCase)

{
  int iVar1;
  wchar_t *pwVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  ON_Internal_Empty_wString *pOVar4;
  bool in_R8B;
  int element_count1;
  ulong uVar5;
  wchar_t *string1;
  
  pwVar2 = *(wchar_t **)prefix;
  string1 = pwVar2;
  if (pwVar2 == &empty_wstring.s) {
    string1 = L"";
  }
  if (pwVar2 == (wchar_t *)0x0) {
    string1 = L"";
  }
  pOVar4 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
  if (pwVar2 == (wchar_t *)0x0) {
    pOVar4 = &empty_wstring;
  }
  uVar5 = 0;
  if (locale != (ON_Locale *)0x0) {
    do {
      if (*(int *)(locale->m_bcp47_language_tag + uVar5 * 4 + -0x10) == 0) goto LAB_0068132e;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x7ffffffd);
    uVar5 = 0x7ffffffd;
  }
LAB_0068132e:
  element_count1 = (int)uVar5;
  if (((0 < element_count1) && (iVar1 = (pOVar4->header).string_length, element_count1 <= iVar1)) &&
     (bVar3 = Equal(string1,element_count1,(wchar_t *)locale,element_count1,
                    (ON_Locale *)CONCAT71(in_register_00000009,bIgnoreCase),in_R8B), bVar3)) {
    ON_wString(this);
    CopyToArray(this,iVar1 - element_count1,string1 + (uVar5 & 0xffffffff));
    return (ON_wString)(wchar_t *)this;
  }
  ON_wString(this,(ON_wString *)prefix);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::RemovePrefix(
  const wchar_t* prefix,
  const class ON_Locale& locale,
  bool bIgnoreCase
) const
{
  const wchar_t* str = static_cast<const wchar_t*>(*this);
  const int str_len = Length();
  const int prefix_length = ON_wString::Length(prefix);
  if (
    prefix_length > 0
    && str_len >= prefix_length
    && ON_wString::Equal(
      str,
      prefix_length,
      prefix,
      prefix_length,
      locale,
      bIgnoreCase)
    )
  {
    ON_wString s;
    s.CopyToArray(str_len - prefix_length, str + prefix_length);
    return s;
  }

  return *this;
}